

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

double __thiscall
gmlc::utilities::strViewToFloat<double>(utilities *this,string_view input,size_t *charactersUsed)

{
  out_of_range *this_00;
  long *plVar1;
  code *pcVar2;
  char *pcVar3;
  undefined *puVar4;
  undefined1 auVar5 [12];
  double val;
  double local_18;
  
  plVar1 = (long *)input._M_str;
  pcVar3 = (char *)input._M_len;
  local_18 = 0.0;
  if (plVar1 != (long *)0x0) {
    *plVar1 = 0;
  }
  auVar5 = std::from_chars(pcVar3,(char *)(this + (long)pcVar3),&local_18,general);
  if (auVar5._8_4_ == 0) {
    if (plVar1 != (long *)0x0) {
      *plVar1 = auVar5._0_8_ - (long)pcVar3;
    }
    return local_18;
  }
  if (auVar5._8_4_ == 0x22) {
    if (plVar1 != (long *)0x0) {
      *plVar1 = auVar5._0_8_ - (long)pcVar3;
    }
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"conversion type does not support the string conversion");
    puVar4 = &std::out_of_range::typeinfo;
    pcVar2 = std::out_of_range::~out_of_range;
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this_00,"unable to convert string");
    puVar4 = &std::invalid_argument::typeinfo;
    pcVar2 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar4,pcVar2);
}

Assistant:

X strViewToFloat(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(
        std::is_floating_point_v<X>, "requested type is not floating point");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc{}) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    throw(std::invalid_argument("unable to convert string"));
}